

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<float,double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t row_1;
  size_t cnt;
  size_t row;
  double out;
  double n;
  double diff;
  double delta_div;
  double delta_s;
  double delta;
  double M4;
  double M3;
  double M2;
  double m;
  double local_b8;
  byte local_a9;
  double local_a8;
  undefined8 in_stack_ffffffffffffff68;
  float *in_stack_ffffffffffffff70;
  float *x_00;
  size_t in_stack_ffffffffffffff78;
  ulong end_00;
  size_t in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_8;
  
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  end_00 = in_RSI;
  if (in_R8D == 0) {
    for (; end_00 <= in_RDX; end_00 = end_00 + 1) {
      lVar4 = (end_00 - in_RSI) + 1;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      in_stack_ffffffffffffff88 =
           (size_t *)
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      dVar6 = (double)*(float *)(in_RCX + *(long *)(in_RDI + end_00 * 8) * 4) - local_38;
      dVar7 = dVar6 / (double)in_stack_ffffffffffffff88;
      lVar4 = end_00 - in_RSI;
      auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar12._0_8_ = lVar4;
      auVar12._12_4_ = 0x45300000;
      dVar6 = dVar6 * dVar7 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      local_38 = dVar7 + local_38;
      local_50 = -(dVar7 * 4.0) * local_48 +
                 dVar6 * dVar7 * dVar7 *
                 ((double)in_stack_ffffffffffffff88 * (double)in_stack_ffffffffffffff88 +
                  -((double)in_stack_ffffffffffffff88 * 3.0) + 3.0) + dVar7 * dVar7 * 6.0 * local_40
                 + local_50;
      local_48 = dVar6 * dVar7 * ((double)in_stack_ffffffffffffff88 - 2.0) +
                 -(dVar7 * 3.0 * local_40) + local_48;
      local_40 = dVar6 + local_40;
    }
    uVar2 = std::isnan(local_40);
    bVar1 = false;
    if ((uVar2 & 1) == 0) {
      uVar2 = std::isinf(local_40);
      bVar1 = false;
      if ((uVar2 & 1) == 0) {
        bVar1 = local_40 <= 0.0;
      }
    }
    if ((!bVar1) ||
       (bVar1 = check_more_than_two_unique_values<float>
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,end_00,
                           in_stack_ffffffffffffff70,
                           (MissingAction)((ulong)in_stack_ffffffffffffff68 >> 0x20)), bVar1)) {
      lVar4 = (in_RDX - in_RSI) + 1;
      auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar10._0_8_ = lVar4;
      auVar10._12_4_ = 0x45300000;
      local_a8 = (local_50 / local_40) *
                 (((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / local_40);
      uVar2 = std::isnan(local_a8);
      if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(local_a8), (uVar2 & 1) == 0)) {
        if (local_a8 <= 0.0) {
          local_a8 = 0.0;
        }
      }
      else {
        local_a8 = -INFINITY;
      }
      local_8 = local_a8;
    }
    else {
      local_8 = -INFINITY;
    }
  }
  else {
    x_00 = (float *)0x0;
    for (; in_RSI <= in_RDX; in_RSI = in_RSI + 1) {
      uVar2 = std::isnan((double)(ulong)*(uint *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4));
      local_a9 = 1;
      if ((uVar2 & 1) == 0) {
        iVar3 = std::isinf((double)(ulong)*(uint *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4));
        local_a9 = (byte)iVar3;
      }
      if (((local_a9 ^ 0xff) & 1) != 0) {
        pfVar5 = (float *)((long)x_00 + 1);
        auVar9._8_4_ = (int)((ulong)pfVar5 >> 0x20);
        auVar9._0_8_ = pfVar5;
        auVar9._12_4_ = 0x45300000;
        in_stack_ffffffffffffff88 =
             (size_t *)
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)pfVar5) - 4503599627370496.0));
        dVar6 = (double)*(float *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4) - local_38;
        dVar7 = dVar6 / (double)in_stack_ffffffffffffff88;
        auVar13._8_4_ = (int)((ulong)x_00 >> 0x20);
        auVar13._0_8_ = x_00;
        auVar13._12_4_ = 0x45300000;
        dVar6 = dVar6 * dVar7 * ((auVar13._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)x_00) - 4503599627370496.0));
        local_38 = dVar7 + local_38;
        local_50 = -(dVar7 * 4.0) * local_48 +
                   dVar6 * dVar7 * dVar7 *
                   ((double)in_stack_ffffffffffffff88 * (double)in_stack_ffffffffffffff88 +
                    -((double)in_stack_ffffffffffffff88 * 3.0) + 3.0) +
                   dVar7 * dVar7 * 6.0 * local_40 + local_50;
        local_48 = dVar6 * dVar7 * ((double)in_stack_ffffffffffffff88 - 2.0) +
                   -(dVar7 * 3.0 * local_40) + local_48;
        local_40 = dVar6 + local_40;
        x_00 = pfVar5;
      }
    }
    if (x_00 == (float *)0x0) {
      local_8 = -INFINITY;
    }
    else {
      uVar2 = std::isnan(local_40);
      bVar1 = false;
      if ((uVar2 & 1) == 0) {
        uVar2 = std::isinf(local_40);
        bVar1 = false;
        if ((uVar2 & 1) == 0) {
          bVar1 = local_40 <= 0.0;
        }
      }
      if ((!bVar1) ||
         (bVar1 = check_more_than_two_unique_values<float>
                            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78,x_00,(MissingAction)(in_RSI >> 0x20)), bVar1)
         ) {
        auVar11._8_4_ = (int)((ulong)x_00 >> 0x20);
        auVar11._0_8_ = x_00;
        auVar11._12_4_ = 0x45300000;
        local_b8 = (local_50 / local_40) *
                   (((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)x_00) - 4503599627370496.0)) / local_40);
        uVar2 = std::isnan(local_b8);
        if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(local_b8), (uVar2 & 1) == 0)) {
          if (local_b8 <= 0.0) {
            local_b8 = 0.0;
          }
        }
        else {
          local_b8 = -INFINITY;
        }
        local_8 = local_b8;
      }
      else {
        local_8 = -INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}